

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O1

ngx_slab_page_t * ngx_slab_alloc_pages(ngx_slab_pool_t *pool,ngx_uint_t pages)

{
  ulong uVar1;
  ngx_slab_page_t *pnVar2;
  ngx_slab_page_t *pnVar3;
  ngx_slab_page_t **ppnVar4;
  ngx_slab_page_t *pnVar5;
  long lVar6;
  ngx_slab_page_t *pnVar7;
  
  pnVar2 = (pool->free).next;
  while( true ) {
    if (pnVar2 == &pool->free) {
      if ((pool->field_0x79 & 1) != 0) {
        ngx_slab_error(pool,3,"ngx_slab_alloc() failed: no memory");
      }
      return (ngx_slab_page_t *)0x0;
    }
    uVar1 = pnVar2->slab;
    if (uVar1 >= pages) break;
    pnVar2 = pnVar2->next;
  }
  if (uVar1 < pages || uVar1 - pages == 0) {
    pnVar3 = pnVar2->next;
    pnVar5 = (ngx_slab_page_t *)pnVar2->prev;
    pnVar7 = pnVar5;
  }
  else {
    pnVar3 = pnVar2 + pages;
    pnVar2[uVar1 - 1].prev = (uintptr_t)pnVar3;
    pnVar3->slab = uVar1 - pages;
    pnVar3->next = pnVar2->next;
    pnVar3->prev = pnVar2->prev;
    pnVar5 = (ngx_slab_page_t *)pnVar2->prev;
    pnVar7 = pnVar3;
  }
  pnVar5->next = pnVar3;
  pnVar2->next->prev = (uintptr_t)pnVar7;
  pnVar2->slab = pages | 0x8000000000000000;
  pnVar2->next = (ngx_slab_page_t *)0x0;
  pnVar2->prev = 0;
  pool->pfree = pool->pfree - pages;
  lVar6 = pages - 1;
  if (lVar6 == 0) {
    return pnVar2;
  }
  ppnVar4 = &pnVar2[1].next;
  do {
    ((ngx_slab_page_t *)(ppnVar4 + -1))->slab = 0xffffffffffffffff;
    *ppnVar4 = (ngx_slab_page_t *)0x0;
    ppnVar4[1] = (ngx_slab_page_t *)0x0;
    ppnVar4 = ppnVar4 + 3;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  return pnVar2;
}

Assistant:

static ngx_slab_page_t *
ngx_slab_alloc_pages(ngx_slab_pool_t *pool, ngx_uint_t pages)
{
    ngx_slab_page_t  *page, *p;

    for (page = pool->free.next; page != &pool->free; page = page->next) {

        if (page->slab >= pages) {

            if (page->slab > pages) {
                page[page->slab - 1].prev = (uintptr_t) &page[pages];

                page[pages].slab = page->slab - pages;
                page[pages].next = page->next;
                page[pages].prev = page->prev;

                p = (ngx_slab_page_t *) page->prev;
                p->next = &page[pages];
                page->next->prev = (uintptr_t) &page[pages];

            } else {
                p = (ngx_slab_page_t *) page->prev;
                p->next = page->next;
                page->next->prev = page->prev;
            }

            page->slab = pages | NGX_SLAB_PAGE_START;
            page->next = NULL;
            page->prev = NGX_SLAB_PAGE;

            pool->pfree -= pages;

            if (--pages == 0) {
                return page;
            }

            for (p = page + 1; pages; pages--) {
                p->slab = NGX_SLAB_PAGE_BUSY;
                p->next = NULL;
                p->prev = NGX_SLAB_PAGE;
                p++;
            }

            return page;
        }
    }

    if (pool->log_nomem) {
        ngx_slab_error(pool, NGX_LOG_CRIT,
                       "ngx_slab_alloc() failed: no memory");
    }

    return NULL;
}